

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrystalMine.hpp
# Opt level: O3

void __thiscall CrystalMine::~CrystalMine(CrystalMine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00118c28;
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Holding::~Holding(&this->super_Holding);
  return;
}

Assistant:

virtual ~CrystalMine() {}